

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson_cursor.hpp
# Opt level: O2

void __thiscall
jsoncons::bson::basic_bson_cursor<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::
reset(basic_bson_cursor<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_> *this)

{
  int iVar1;
  
  basic_bson_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::reset
            (&this->parser_);
  basic_staj_visitor<char>::reset(&this->cursor_visitor_);
  this->eof_ = false;
  iVar1 = (*(this->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor[3])(this);
  if ((char)iVar1 != '\0') {
    return;
  }
  (*(this->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor[7])(this);
  return;
}

Assistant:

void reset()
    {
        parser_.reset();
        cursor_visitor_.reset();
        eof_ = false;
        if (!done())
        {
            next();
        }
    }